

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::anon_unknown_1::renderTestProgress(int current_test,int total_tests,string *next_test)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  ostream *poVar4;
  int in_ESI;
  int in_EDI;
  string result;
  int render_width;
  double progress;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe08;
  string local_1d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  string local_1b8 [4];
  int in_stack_fffffffffffffe4c;
  allocator local_191;
  string local_190 [32];
  string local_170 [32];
  string local_150 [48];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [36];
  int local_1c;
  double local_18;
  
  local_18 = (double)in_EDI / (double)in_ESI;
  local_1c = 0x50;
  clara::std::__cxx11::to_string(in_stack_fffffffffffffe4c);
  std::operator+((char *)in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  std::operator+(in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe00);
  clara::std::__cxx11::to_string(in_stack_fffffffffffffe4c);
  std::operator+(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  std::operator+(in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe00);
  clara::std::__cxx11::to_string(in_stack_fffffffffffffe4c);
  std::operator+(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  std::operator+(in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe00);
  std::operator+(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_170);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string(local_150);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_100);
  std::__cxx11::string::~string(local_120);
  uVar1 = std::__cxx11::string::size();
  if (uVar1 < (ulong)(long)local_1c) {
    lVar2 = (long)local_1c;
    lVar3 = std::__cxx11::string::size();
    uVar1 = lVar2 - lVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_190,uVar1,' ',&local_191);
    std::__cxx11::string::operator+=(local_40,local_190);
    std::__cxx11::string::~string(local_190);
    std::allocator<char>::~allocator((allocator<char> *)&local_191);
  }
  else {
    uVar1 = std::__cxx11::string::size();
    if ((ulong)(long)local_1c < uVar1) {
      std::__cxx11::string::substr((ulong)local_1d8,(ulong)local_40);
      std::operator+(in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe00);
      std::__cxx11::string::operator=(local_40,local_1b8);
      std::__cxx11::string::~string(local_1b8);
      std::__cxx11::string::~string(local_1d8);
    }
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"\r");
  std::operator<<(poVar4,local_40);
  std::ostream::flush();
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void renderTestProgress(int current_test, int total_tests, std::string next_test) {
            double progress = (double) current_test / (double) total_tests;
            int render_width = 80;
            std::string result = "[" + std::to_string(current_test) + "/" + std::to_string(total_tests) + "] (" + std::to_string(int(progress * 100)) + "%): " + next_test;
            if (result.size() < render_width) {
                result += std::string(render_width - result.size(), ' ');
            } else if (result.size() > render_width) {
                result = result.substr(0, render_width - 3) + "...";
            }
            std::cout << "\r" << result;
            std::cout.flush();
        }